

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

uint __thiscall
ON_3dPointListRef::SetFromDoubleArray
          (ON_3dPointListRef *this,size_t point_count,size_t point_stride,double *point_array)

{
  uint uVar1;
  
  this->m_fP = (float *)0x0;
  this->m_point_count = 0;
  this->m_point_stride = 0;
  this->m_dP = (double *)0x0;
  uVar1 = 0;
  if (((point_array != (double *)0x0) && (point_count - 1 < 0xfffffffe)) &&
     (point_stride - 3 < 0xfffffffc)) {
    this->m_point_count = (uint)point_count;
    this->m_point_stride = (uint)point_stride;
    this->m_dP = point_array;
    uVar1 = (uint)point_count;
  }
  return uVar1;
}

Assistant:

unsigned int ON_3dPointListRef::SetFromDoubleArray(
    size_t point_count,
    size_t point_stride,
    const double* point_array
    )
{
  *this = ON_3dPointListRef::EmptyPointList;
  if ( point_count > 0 
       && point_count < (size_t)ON_UNSET_UINT_INDEX 
       && point_stride >= 3
       && point_stride < (size_t)ON_UNSET_UINT_INDEX 
       && 0 != point_array
       )
  {
    m_point_count = (unsigned int)point_count;
    m_point_stride = (unsigned int)point_stride;
    m_dP = point_array;
  }
  return m_point_count;
}